

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.h
# Opt level: O0

void __thiscall
cnpy::NpyArray::NpyArray
          (NpyArray *this,vector<unsigned_long,_std::allocator<unsigned_long>_> *_shape,
          size_t _word_size,char _type_code,bool _fortran_order)

{
  allocator_type *paVar1;
  reference pvVar2;
  vector<char,_std::allocator<char>_> *__p;
  _Tp_alloc_type in_CL;
  undefined8 in_RDX;
  vector<char,_std::allocator<char>_> *in_RDI;
  byte in_R8B;
  size_t i;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> *this_00;
  vector<char,_std::allocator<char>_> *this_01;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> local_49;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffc8;
  allocator_type *__a;
  allocator_type *__n;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffd0;
  
  this_01 = in_RDI;
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0x165ea0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  *(undefined8 *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10 =
       in_RDX;
  in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Tp_alloc_type = in_CL;
  in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x1 = in_R8B & 1;
  *(undefined8 *)&in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 = 1;
  __a = (allocator_type *)0x0;
  while( true ) {
    __n = __a;
    paVar1 = (allocator_type *)
             std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         field_0x10);
    if (paVar1 <= __a) break;
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        &(in_RDI->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                         field_0x10,(size_type)__n);
    *(value_type *)&in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 =
         *pvVar2 * *(long *)&in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             field_0x8;
    __a = __n + 1;
  }
  operator_new(0x18);
  __p = (vector<char,_std::allocator<char>_> *)
        (*(long *)&in_RDI[2].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x8 *
        *(long *)&in_RDI[1].super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
  this_00 = &local_49;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector(this_01,(size_type)in_RDI,__a);
  std::shared_ptr<std::vector<char,std::allocator<char>>>::
  shared_ptr<std::vector<char,std::allocator<char>>,void>(this_00,__p);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::operator=
            (this_00,(shared_ptr<std::vector<char,_std::allocator<char>_>_> *)__p);
  std::shared_ptr<std::vector<char,_std::allocator<char>_>_>::~shared_ptr
            ((shared_ptr<std::vector<char,_std::allocator<char>_>_> *)0x165fd7);
  std::allocator<char>::~allocator((allocator<char> *)&local_49);
  return;
}

Assistant:

NpyArray(const std::vector<size_t>& _shape, size_t _word_size, char _type_code, bool _fortran_order) :
            shape(_shape), word_size(_word_size), type_code(_type_code), fortran_order(_fortran_order)
        {
            num_vals = 1;
            for(size_t i = 0;i < shape.size();i++) num_vals *= shape[i];
            data_holder = std::shared_ptr<std::vector<char>>(
                new std::vector<char>(num_vals * word_size));
        }